

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_test_tests.cpp
# Opt level: O0

void __thiscall
test::iu_MultiTypedTest_x_iutest_x_Get_Test<iutest::Types<int,_float>_>::Body
          (iu_MultiTypedTest_x_iutest_x_Get_Test<iutest::Types<int,_float>_> *this)

{
  Fixed *pFVar1;
  AssertionHelper local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  Fixed local_388;
  AssertionHelper local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  Fixed local_1a0;
  iu_MultiTypedTest_x_iutest_x_Get_Test<iutest::Types<int,_float>_> *local_10;
  iu_MultiTypedTest_x_iutest_x_Get_Test<iutest::Types<int,_float>_> *this_local;
  
  local_10 = this;
  memset(&local_1a0,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_1a0);
  iutest::detail::GetTypeNameProxy<int>::GetTypeName_abi_cxx11_();
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_1a0,&local_1c0);
  iutest::AssertionHelper::AssertionHelper
            (&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/typed_test_tests.cpp"
             ,0x62,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_200,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_200);
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::AssertionHelper::Fixed::~Fixed(&local_1a0);
  memset(&local_388,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_388);
  iutest::detail::GetTypeNameProxy<float>::GetTypeName_abi_cxx11_();
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_388,&local_3a8);
  iutest::AssertionHelper::AssertionHelper
            (&local_3d8,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/typed_test_tests.cpp"
             ,99,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_3d8,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_3d8);
  std::__cxx11::string::~string((string *)&local_3a8);
  iutest::AssertionHelper::Fixed::~Fixed(&local_388);
  return;
}

Assistant:

IUTEST_TYPED_TEST(MultiTypedTest, Get)
{
    typedef typename TypeParam:: template get<0>::type  Type1;
    typedef typename TypeParam:: template get<1>::type  Type2;

#if IUTEST_HAS_STATIC_ASSERT_TYPEEQ
    ::iutest::StaticAssertTypeEq< Type1, int >();
#endif
    IUTEST_SUCCEED() << ::iutest::detail::GetTypeNameProxy< Type1 >::GetTypeName();
    IUTEST_SUCCEED() << ::iutest::detail::GetTypeNameProxy< Type2 >::GetTypeName();
}